

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O0

uint __thiscall
TArray<lightlist_t,_lightlist_t>::Push(TArray<lightlist_t,_lightlist_t> *this,lightlist_t *item)

{
  uint uVar1;
  lightlist_t *item_local;
  TArray<lightlist_t,_lightlist_t> *this_local;
  
  Grow(this,1);
  lightlist_t::lightlist_t(this->Array + this->Count,item);
  uVar1 = this->Count;
  this->Count = uVar1 + 1;
  return uVar1;
}

Assistant:

unsigned int Push (const T &item)
	{
		Grow (1);
		::new((void*)&Array[Count]) T(item);
		return Count++;
	}